

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O1

void __thiscall t_swift_generator::generate_enum(t_swift_generator *this,t_enum *tenum)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer pptVar5;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string local_98;
  ofstream_with_content_based_conditional_update *local_78;
  string local_70;
  t_enum *local_50;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> local_48;
  
  if (this->gen_cocoa_ == true) {
    generate_old_enum(this,tenum);
    return;
  }
  poVar1 = &this->f_decl_;
  local_50 = tenum;
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"public enum ",0xc);
  iVar3 = (*(local_50->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,*(char **)CONCAT44(extraout_var,iVar3),
                      ((undefined8 *)CONCAT44(extraout_var,iVar3))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," : TEnum",8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_78 = poVar1;
  block_open(this,(ostream *)poVar1);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            (&local_48,&local_50->constants_);
  if (local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar5 = local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_78,local_98._M_dataplus._M_p,local_98._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"case ",5);
      enum_case_name_abi_cxx11_(&local_70,this,*pptVar5,true);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      pptVar5 = pptVar5 + 1;
    } while (pptVar5 !=
             local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  poVar1 = local_78;
  if (this->safe_enums_ == true) {
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"case unknown(Int32)",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"public static func read(from proto: TProtocol) throws -> ",0x39);
  iVar3 = (*(local_50->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,*(char **)CONCAT44(extraout_var_00,iVar3),
             ((undefined8 *)CONCAT44(extraout_var_00,iVar3))[1]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  poVar1 = local_78;
  block_open(this,(ostream *)local_78);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"let raw: Int32 = try proto.read()",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"let new = ",10);
  iVar3 = (*(local_50->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,*(char **)CONCAT44(extraout_var_01,iVar3),
                      ((undefined8 *)CONCAT44(extraout_var_01,iVar3))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(rawValue: raw)",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar1 = local_78;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_78,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"if let unwrapped = new {",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"return unwrapped",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"} else {",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"throw TProtocolError(error: .invalidData,",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"                     message: \"Invalid enum value (\\(raw)) for \\(",0x41);
  iVar3 = (*(local_50->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,*(char **)CONCAT44(extraout_var_02,iVar3),
                      ((undefined8 *)CONCAT44(extraout_var_02,iVar3))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,".self)\")",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar1 = local_78;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_78,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  block_close(this,(ostream *)poVar1,true);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"public init()",0xd);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  block_open(this,(ostream *)poVar1);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"self = .",8);
  enum_case_name_abi_cxx11_
            (&local_70,this,
             *local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
              super__Vector_impl_data._M_start,false);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar1 = local_78;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  block_close(this,(ostream *)poVar1,true);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"public var rawValue: Int32",0x1a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  block_open(this,(ostream *)poVar1);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"switch self {",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar5 = local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_78,local_98._M_dataplus._M_p,local_98._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"case .",6);
      enum_case_name_abi_cxx11_(&local_70,this,*pptVar5,true);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": return ",9);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(*pptVar5)->value_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      pptVar5 = pptVar5 + 1;
    } while (pptVar5 !=
             local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  poVar1 = local_78;
  if (this->safe_enums_ == true) {
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"case .unknown(let value): return value",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  block_close(this,(ostream *)poVar1,true);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"public init?(rawValue: Int32)",0x1d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  block_open(this,(ostream *)poVar1);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"switch rawValue {",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar5 = local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_78,local_98._M_dataplus._M_p,local_98._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"case ",5);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(*pptVar5)->value_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": self = .",10);
      enum_case_name_abi_cxx11_(&local_70,this,*pptVar5,true);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      pptVar5 = pptVar5 + 1;
    } while (pptVar5 !=
             local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  poVar1 = local_78;
  if (this->safe_enums_ == false) {
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"default: return nil",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"default: self = .unknown(rawValue)",0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  block_close(this,(ostream *)poVar1,true);
  block_close(this,(ostream *)poVar1,true);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  if (local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_swift_generator::generate_enum(t_enum* tenum) {
  if (gen_cocoa_) {
    generate_old_enum(tenum);
    return;
  }
  f_decl_ << indent() << "public enum " << tenum->get_name() << " : TEnum";
  block_open(f_decl_);

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;

  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    f_decl_ << indent() << "case " << enum_case_name((*c_iter), true) << endl;
  }

  // unknown associated value case for safety and similar behavior to other languages
  if (safe_enums_) {
    f_decl_ << indent() << "case unknown(Int32)" << endl;
  }
  f_decl_ << endl;

  // TSerializable read(from:)
  f_decl_ << indent() << "public static func read(from proto: TProtocol) throws -> "
          << tenum->get_name();
  block_open(f_decl_);
  f_decl_ << indent() << "let raw: Int32 = try proto.read()" << endl;
  f_decl_ << indent() << "let new = " << tenum->get_name() << "(rawValue: raw)" << endl;

  f_decl_ << indent() << "if let unwrapped = new {" << endl;
  indent_up();
  f_decl_ << indent() << "return unwrapped" << endl;
  indent_down();
  f_decl_ << indent() << "} else {" << endl;
  indent_up();
  f_decl_ << indent() << "throw TProtocolError(error: .invalidData," << endl;
  f_decl_ << indent() << "                     message: \"Invalid enum value (\\(raw)) for \\("
          << tenum->get_name() << ".self)\")" << endl;
  indent_down();
  f_decl_ << indent() << "}" << endl;
  block_close(f_decl_);

  // empty init for TSerializable
  f_decl_ << endl;
  f_decl_ << indent() << "public init()";
  block_open(f_decl_);

  f_decl_ << indent() << "self = ." << enum_case_name(constants.front(), false) << endl;
  block_close(f_decl_);
  f_decl_ << endl;

  // rawValue getter
  f_decl_ << indent() << "public var rawValue: Int32";
  block_open(f_decl_);
  f_decl_ << indent() << "switch self {" << endl;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    f_decl_ << indent() << "case ." << enum_case_name((*c_iter), true)
            << ": return " << (*c_iter)->get_value() << endl;
  }
  if (safe_enums_) {
    f_decl_ << indent() << "case .unknown(let value): return value" << endl;
  }
  f_decl_ << indent() << "}" << endl;
  block_close(f_decl_);
  f_decl_ << endl;

  // convenience rawValue initalizer
  f_decl_ << indent() << "public init?(rawValue: Int32)";
  block_open(f_decl_);
  f_decl_ << indent() << "switch rawValue {" << endl;;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    f_decl_ << indent() << "case " << (*c_iter)->get_value()
            << ": self = ." << enum_case_name((*c_iter), true) << endl;
  }
  if (!safe_enums_) {
    f_decl_ << indent() << "default: return nil" << endl;
  } else {
    f_decl_ << indent() << "default: self = .unknown(rawValue)" << endl;
  }
  f_decl_ << indent() << "}" << endl;
  block_close(f_decl_);




  block_close(f_decl_);
  f_decl_ << endl;
}